

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

void __thiscall lunasvg::SVGGeometryElement::render(SVGGeometryElement *this,SVGRenderState *state)

{
  pointer pSVar1;
  bool bVar2;
  SVGMarkerPosition *markerPosition;
  pointer this_00;
  SVGRenderState newState;
  SVGBlendInfo blendInfo;
  SVGRenderState SStack_98;
  SVGBlendInfo local_58;
  Transform local_40;
  
  bVar2 = isRenderable(this);
  if (bVar2) {
    SVGBlendInfo::SVGBlendInfo(&local_58,(SVGElement *)this);
    (*(this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode[10])
              (&local_40,this);
    SVGRenderState::SVGRenderState(&SStack_98,(SVGElement *)this,state,&local_40);
    SVGRenderState::beginGroup(&SStack_98,&local_58);
    if (SStack_98.m_mode == Clipping) {
      Canvas::setColor(SStack_98.m_canvas.
                       super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (Color *)&Color::White);
      Canvas::fillPath(SStack_98.m_canvas.
                       super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &this->m_path,this->m_clip_rule,&SStack_98.m_currentTransform);
    }
    else {
      bVar2 = SVGPaintServer::applyPaint(&this->m_fill,&SStack_98);
      if (bVar2) {
        Canvas::fillPath(SStack_98.m_canvas.
                         super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &this->m_path,this->m_fill_rule,&SStack_98.m_currentTransform);
      }
      bVar2 = SVGPaintServer::applyPaint(&this->m_stroke,&SStack_98);
      if (bVar2) {
        Canvas::strokePath(SStack_98.m_canvas.
                           super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &this->m_path,&this->m_strokeData,&SStack_98.m_currentTransform);
      }
      pSVar1 = (this->m_markerPositions).
               super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (this->m_markerPositions).
                     super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != pSVar1;
          this_00 = this_00 + 1) {
        SVGMarkerPosition::renderMarker(this_00,&SStack_98,(this->m_strokeData).m_lineWidth);
      }
    }
    SVGRenderState::endGroup(&SStack_98,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&SStack_98.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void SVGGeometryElement::render(SVGRenderState& state) const
{
    if(!isRenderable())
        return;
    SVGBlendInfo blendInfo(this);
    SVGRenderState newState(this, state, localTransform());
    newState.beginGroup(blendInfo);
    if(newState.mode() == SVGRenderMode::Clipping) {
        newState->setColor(Color::White);
        newState->fillPath(m_path, m_clip_rule, newState.currentTransform());
    } else {
        if(m_fill.applyPaint(newState))
            newState->fillPath(m_path, m_fill_rule, newState.currentTransform());
        if(m_stroke.applyPaint(newState)) {
            newState->strokePath(m_path, m_strokeData, newState.currentTransform());
        }

        for(const auto& markerPosition : m_markerPositions) {
            markerPosition.renderMarker(newState, m_strokeData.lineWidth());
        }
    }

    newState.endGroup(blendInfo);
}